

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_descriptor.cpp
# Opt level: O3

OptionBuilder * __thiscall
program_options::OptionBuilder::operator()(OptionBuilder *this,char *key,char *description)

{
  options_description *poVar1;
  shared_ptr<program_options::option_description> option;
  undefined1 local_59;
  value_type local_58;
  option_description *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  untyped_value *local_38;
  char *local_30;
  char *local_28;
  
  local_30 = description;
  local_28 = key;
  local_38 = (untyped_value *)operator_new(0x10);
  (local_38->super_value_base)._vptr_value_base = (_func_int **)&PTR__value_base_001716c8;
  local_38->m_zero_tokens = true;
  local_48 = (option_description *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<program_options::option_description,std::allocator<program_options::option_description>,char_const*&,program_options::untyped_value*,char_const*&>
            (&local_40,&local_48,(allocator<program_options::option_description> *)&local_59,
             &local_28,&local_38,&local_30);
  poVar1 = this->m_root;
  local_58.super___shared_ptr<program_options::option_description,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = local_48;
  local_58.super___shared_ptr<program_options::option_description,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = local_40._M_pi;
  if (local_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_40._M_pi)->_M_use_count = (local_40._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_40._M_pi)->_M_use_count = (local_40._M_pi)->_M_use_count + 1;
    }
  }
  std::
  vector<std::shared_ptr<program_options::option_description>,_std::allocator<std::shared_ptr<program_options::option_description>_>_>
  ::push_back(&poVar1->m_options,&local_58);
  std::vector<bool,_std::allocator<bool>_>::push_back(&poVar1->belong_to_group,false);
  if (local_58.super___shared_ptr<program_options::option_description,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.
               super___shared_ptr<program_options::option_description,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40._M_pi);
  }
  return this;
}

Assistant:

OptionBuilder& OptionBuilder::operator()(const char* key, const char* description) {
    auto option = std::make_shared<option_description>(key, new untyped_value(true), description);
    m_root.add(option);
    return *this;
}